

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
image_metrics::compute
          (image_metrics *this,image_u8 *a,image_u8 *b,uint32_t first_channel,uint32_t num_channels)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint32_t i;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  long lVar8;
  uint32_t uVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  color_quad_u8 *this_00;
  uint uVar13;
  color_quad_u8 *this_01;
  uint32_t x;
  uint uVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double hist [256];
  
  uVar1 = a->m_width;
  if (b->m_width < a->m_width) {
    uVar1 = b->m_width;
  }
  uVar2 = a->m_height;
  if (b->m_height < a->m_height) {
    uVar2 = b->m_height;
  }
  memset(hist,0,0x800);
  for (uVar13 = 0; uVar13 != uVar2; uVar13 = uVar13 + 1) {
    for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
      this_00 = (a->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
                _M_impl.super__Vector_impl_data._M_start + (a->m_width * uVar13 + uVar14);
      this_01 = (b->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
                _M_impl.super__Vector_impl_data._M_start + (b->m_width * uVar13 + uVar14);
      uVar10 = (ulong)num_channels;
      uVar6 = first_channel;
      if (num_channels == 0) {
        iVar4 = color_quad_u8::get_luma(this_00);
        iVar5 = color_quad_u8::get_luma(this_01);
        uVar12 = iVar4 - iVar5;
        uVar6 = -uVar12;
        if (0 < (int)uVar12) {
          uVar6 = uVar12;
        }
        hist[uVar6] = hist[uVar6] + 1.0;
      }
      else {
        while( true ) {
          bVar15 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar15) break;
          iVar4 = (uint)this_00->m_c[uVar6] - (uint)this_01->m_c[uVar6];
          bVar3 = (byte)iVar4;
          bVar11 = -bVar3;
          if (0 < iVar4) {
            bVar11 = bVar3;
          }
          hist[bVar11] = hist[bVar11] + 1.0;
          uVar6 = uVar6 + 1;
        }
      }
    }
  }
  this->m_max = 0.0;
  auVar18 = ZEXT816(0);
  dVar19 = 0.0;
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    dVar17 = hist[lVar8];
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar21 = (double)(int)lVar8;
      dVar16 = auVar18._0_8_;
      dVar22 = dVar21;
      if (dVar21 <= dVar19) {
        dVar22 = dVar19;
      }
      this->m_max = dVar22;
      auVar18._8_8_ = dVar17 * dVar21 * dVar21 + auVar18._8_8_;
      auVar18._0_8_ = dVar16 + dVar17 * dVar21;
      dVar19 = dVar22;
    }
  }
  uVar7 = 4;
  if (num_channels < 4) {
    uVar7 = num_channels;
  }
  uVar9 = 1;
  if (num_channels != 0) {
    uVar9 = uVar7;
  }
  auVar20._0_8_ = (double)(int)uVar9 * (double)(uVar2 * uVar1);
  auVar20._8_8_ = auVar20._0_8_;
  auVar18 = divpd(auVar18,auVar20);
  auVar20 = minpd(_DAT_001200a0,auVar18);
  dVar19 = (double)(-(ulong)(0.0 <= auVar18._8_8_) & auVar20._8_8_);
  this->m_mean = (double)(-(ulong)(0.0 <= auVar18._0_8_) & auVar20._0_8_);
  this->m_mean_squared = dVar19;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  this->m_root_mean_squared = dVar19;
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    dVar17 = log10(255.0 / dVar19);
    dVar17 = dVar17 * 20.0;
    dVar19 = 100.0;
    if (dVar17 <= 100.0) {
      dVar19 = dVar17;
    }
    dVar19 = (double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar19);
  }
  else {
    dVar19 = 100.0;
  }
  this->m_peak_snr = dVar19;
  return;
}

Assistant:

void compute(const image_u8 &a, const image_u8 &b, uint32_t first_channel, uint32_t num_channels)
	{
		const bool average_component_error = true;

		const uint32_t width = std::min(a.width(), b.width());
		const uint32_t height = std::min(a.height(), b.height());

		assert((first_channel < 4U) && (first_channel + num_channels <= 4U));

		// Histogram approach originally due to Charles Bloom.
		double hist[256];
		memset(hist, 0, sizeof(hist));

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_quad_u8 &ca = a(x, y);
				const color_quad_u8 &cb = b(x, y);

				if (!num_channels)
					hist[iabs(ca.get_luma() - cb.get_luma())]++;
				else
				{
					for (uint32_t c = 0; c < num_channels; c++)
						hist[iabs(ca[first_channel + c] - cb[first_channel + c])]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (!hist[i])
				continue;

			m_max = std::max<double>(m_max, i);

			double x = i * hist[i];

			sum += x;
			sum2 += i * x;
		}

		// See http://richg42.blogspot.com/2016/09/how-to-compute-psnr-from-old-berkeley.html
		double total_values = width * height;

		if (average_component_error)
			total_values *= clamp<uint32_t>(num_channels, 1, 4);

		m_mean = clamp<double>(sum / total_values, 0.0f, 255.0f);
		m_mean_squared = clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

		m_root_mean_squared = sqrt(m_mean_squared);

		if (!m_root_mean_squared)
			m_peak_snr = 100.0f;
		else
			m_peak_snr = clamp<double>(log10(255.0f / m_root_mean_squared) * 20.0f, 0.0f, 100.0f);
	}